

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getmodel.cpp
# Opt level: O1

void __thiscall getmodel::doCdfInnerNoIntensityUncertaintyz(getmodel *this,FILE *fin,int event_id)

{
  _Rb_tree_header *p_Var1;
  AREAPERIL_INT AVar2;
  long lVar3;
  pointer puVar4;
  uint uVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  int extraout_EDX;
  _Rb_tree_header *p_Var8;
  int iVar9;
  FILE *pFVar10;
  _Base_ptr p_Var11;
  getmodel *this_00;
  int iVar12;
  AREAPERIL_INT *areaperil_id;
  uLong dest_length;
  key_type kStack_94;
  FILE *pFStack_90;
  AREAPERIL_INT AStack_84;
  int iStack_80;
  getmodel *pgStack_78;
  key_type *pkStack_70;
  int local_3c;
  ulong local_38;
  
  p_Var1 = &(this->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = (this->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var11 != (_Base_ptr)0x0;
      p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < event_id]) {
    if (event_id <= (int)p_Var11[1]._M_color) {
      p_Var7 = p_Var11;
    }
  }
  p_Var11 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
     (p_Var11 = p_Var7, event_id < (int)p_Var7[1]._M_color)) {
    p_Var11 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    local_3c = event_id;
    pmVar6 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](&this->_event_index_by_event_id,&local_3c);
    fseek((FILE *)fin,pmVar6->offset,0);
    pmVar6 = std::
             map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
             ::operator[](&this->_event_index_by_event_id,&local_3c);
    lVar3 = pmVar6->size;
    iVar9 = (int)lVar3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_compressed_buf,(long)(iVar9 + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->_uncompressed_buf,(lVar3 << 0x22) * 5 >> 0x20);
    fread((this->_compressed_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start,(long)iVar9,1,(FILE *)fin);
    puVar4 = (this->_uncompressed_buf).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (long)(this->_uncompressed_buf).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar4;
    pFVar10 = (FILE *)&stack0xffffffffffffffc8;
    uVar5 = uncompress(puVar4,pFVar10,
                       (this->_compressed_buf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(long)iVar9);
    if (uVar5 != 0) {
      this_00 = (getmodel *)(ulong)uVar5;
      doCdfInnerNoIntensityUncertaintyz(this_00);
      p_Var1 = &(this_00->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header;
      p_Var11 = (this_00->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      p_Var7 = &p_Var1->_M_header;
      for (; p_Var11 != (_Base_ptr)0x0;
          p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < extraout_EDX]) {
        if (extraout_EDX <= (int)p_Var11[1]._M_color) {
          p_Var7 = p_Var11;
        }
      }
      p_Var11 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
         (p_Var11 = p_Var7, extraout_EDX < (int)p_Var7[1]._M_color)) {
        p_Var11 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var11 != p_Var1) {
        pFStack_90 = pFVar10;
        pgStack_78 = this;
        pkStack_70 = &local_3c;
        pmVar6 = std::
                 map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
                 ::operator[](&this_00->_event_index_by_event_id,&kStack_94);
        iVar9 = 0;
        fseek(pFStack_90,pmVar6->offset,0);
        pmVar6 = std::
                 map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
                 ::operator[](&this_00->_event_index_by_event_id,&kStack_94);
        iVar12 = (int)((ulong)pmVar6->size / 0xc);
        if (0 < iVar12) {
          p_Var1 = &(this_00->_area_perils)._M_t._M_impl.super__Rb_tree_header;
          do {
            fread(&AStack_84,0xc,1,pFStack_90);
            p_Var11 = (this_00->_area_perils)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            p_Var7 = &p_Var1->_M_header;
            for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)AStack_84]) {
              if ((int)AStack_84 <= (int)*(size_t *)(p_Var11 + 1)) {
                p_Var7 = p_Var11;
              }
            }
            p_Var8 = p_Var1;
            if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
               (p_Var8 = (_Rb_tree_header *)p_Var7,
               (int)AStack_84 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
              p_Var8 = p_Var1;
            }
            if (p_Var8 != p_Var1) {
              doResultsNoIntensityUncertainty
                        (this_00,&kStack_94,&AStack_84,&this_00->_vulnerability_ids_by_area_peril,
                         &this_00->_vulnerabilities,iStack_80);
            }
            iVar9 = iVar9 + 1;
          } while (iVar9 != iVar12);
        }
      }
      return;
    }
    iVar9 = (int)(local_38 / 0xc);
    if (0 < iVar9) {
      areaperil_id = (AREAPERIL_INT *)
                     (this->_uncompressed_buf).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      p_Var1 = &(this->_area_perils)._M_t._M_impl.super__Rb_tree_header;
      iVar12 = 0;
      do {
        AVar2 = *areaperil_id;
        p_Var11 = (this->_area_perils)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var7 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
            p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)AVar2]) {
          if ((int)AVar2 <= (int)*(size_t *)(p_Var11 + 1)) {
            p_Var7 = p_Var11;
          }
        }
        p_Var8 = p_Var1;
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var8 = (_Rb_tree_header *)p_Var7,
           (int)AVar2 < (int)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
          p_Var8 = p_Var1;
        }
        if (p_Var8 != p_Var1) {
          doResultsNoIntensityUncertainty
                    (this,&local_3c,areaperil_id,&this->_vulnerability_ids_by_area_peril,
                     &this->_vulnerabilities,areaperil_id[1]);
        }
        areaperil_id = areaperil_id + 3;
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar9);
    }
  }
  return;
}

Assistant:

void getmodel::doCdfInnerNoIntensityUncertaintyz(FILE* fin, int event_id) {
  auto sizeof_EventKey = sizeof(EventRow);
  if (_event_index_by_event_id.count(event_id) == 0)
    return;
  flseek(fin, _event_index_by_event_id[event_id].offset, 0);
  int size = _event_index_by_event_id[event_id].size;
  _compressed_buf.resize(size + 1);
  _uncompressed_buf.resize(size * 20);
  fread(&_compressed_buf[0], size, 1, fin);
  uLong dest_length = _uncompressed_buf.size();
  int ret = uncompress(&_uncompressed_buf[0], &dest_length,
                        &_compressed_buf[0], size);
  if (ret != Z_OK) {
    fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
    exit(-1);
  }    
  // we now have the data length
  int number_of_event_records =
      static_cast<int>(dest_length / sizeof_EventKey);
  EventRow *event_key = (EventRow *)&_uncompressed_buf[0];
  for (int i = 0; i < number_of_event_records; i++) {
    bool do_cdf_for_area_peril =
        (_area_perils.count(event_key->areaperil_id) == 1);
    if (do_cdf_for_area_peril) {
      // Generate and write the results
      doResultsNoIntensityUncertainty(
          event_id, event_key->areaperil_id, _vulnerability_ids_by_area_peril,
          _vulnerabilities, event_key->intensity_bin_id);
    }
    event_key++;
  }
}